

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_matrix.cc
# Opt level: O3

bool __thiscall
sptk::SymmetricMatrix::CholeskyDecomposition
          (SymmetricMatrix *this,SymmetricMatrix *lower_triangular_matrix,
          vector<double,_std::allocator<double>_> *diagonal_elements)

{
  pointer ppdVar1;
  pointer ppdVar2;
  double *pdVar3;
  double *pdVar4;
  int j_1;
  pointer pdVar5;
  uint uVar6;
  ulong uVar7;
  int j;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  
  j_1._0_1_ = false;
  j_1._0_1_ = false;
  if (((this != lower_triangular_matrix) && (lower_triangular_matrix != (SymmetricMatrix *)0x0)) &&
     (j_1._0_1_ = j_1._0_1_, diagonal_elements != (vector<double,_std::allocator<double>_> *)0x0)) {
    dVar10 = **(this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((dVar10 != 0.0) || (NAN(dVar10))) {
      uVar6 = lower_triangular_matrix->num_dimension_;
      if (uVar6 != this->num_dimension_) {
        Resize(lower_triangular_matrix,this->num_dimension_);
        uVar6 = this->num_dimension_;
      }
      pdVar5 = (diagonal_elements->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)(diagonal_elements->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar5 >> 3 != (long)(int)uVar6) {
        std::vector<double,_std::allocator<double>_>::resize(diagonal_elements,(long)(int)uVar6);
        pdVar5 = (diagonal_elements->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar6 = this->num_dimension_;
      }
      ppdVar1 = (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      *pdVar5 = **ppdVar1;
      ppdVar2 = (lower_triangular_matrix->index_).
                super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      **ppdVar2 = 1.0;
      j_1._0_1_ = true;
      if (1 < (int)uVar6) {
        uVar7 = 1;
        do {
          pdVar3 = ppdVar1[uVar7];
          pdVar4 = ppdVar2[uVar7];
          uVar8 = 0;
          do {
            dVar10 = pdVar3[uVar8];
            if (uVar8 != 0) {
              uVar9 = 0;
              do {
                dVar10 = dVar10 - ppdVar2[uVar8][uVar9] * pdVar4[uVar9] * pdVar5[uVar9];
                uVar9 = uVar9 + 1;
              } while (uVar8 != uVar9);
            }
            pdVar4[uVar8] = dVar10 / pdVar5[uVar8];
            uVar8 = uVar8 + 1;
          } while (uVar8 != uVar7);
          dVar10 = pdVar3[uVar7];
          pdVar5[uVar7] = dVar10;
          uVar8 = 0;
          do {
            dVar10 = dVar10 - pdVar4[uVar8] * pdVar4[uVar8] * pdVar5[uVar8];
            pdVar5[uVar7] = dVar10;
            uVar8 = uVar8 + 1;
          } while (uVar7 != uVar8);
          j_1._0_1_ = 1e-12 < ABS(dVar10);
          if (!j_1._0_1_) {
            return j_1._0_1_;
          }
          pdVar4[uVar7] = 1.0;
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar6);
      }
    }
    else {
      j_1._0_1_ = false;
    }
  }
  return j_1._0_1_;
}

Assistant:

bool SymmetricMatrix::CholeskyDecomposition(
    SymmetricMatrix* lower_triangular_matrix,
    std::vector<double>* diagonal_elements) const {
  if (NULL == lower_triangular_matrix || NULL == diagonal_elements ||
      this == lower_triangular_matrix || 0.0 == index_[0][0]) {
    return false;
  }

  if (lower_triangular_matrix->num_dimension_ != num_dimension_) {
    lower_triangular_matrix->Resize(num_dimension_);
  }
  if (diagonal_elements->size() != static_cast<std::size_t>(num_dimension_)) {
    diagonal_elements->resize(num_dimension_);
  }

  double* d(&((*diagonal_elements)[0]));

  d[0] = index_[0][0];
  lower_triangular_matrix->index_[0][0] = 1.0;
  for (int i(1); i < num_dimension_; ++i) {
    for (int j(0); j < i; ++j) {
      double tmp(index_[i][j]);
      for (int k(0); k < j; ++k) {
        tmp -= lower_triangular_matrix->index_[i][k] *
               lower_triangular_matrix->index_[j][k] * d[k];
      }
      lower_triangular_matrix->index_[i][j] = tmp / d[j];
    }

    d[i] = index_[i][i];
    for (int j(0); j < i; ++j) {
      d[i] -= lower_triangular_matrix->index_[i][j] *
              lower_triangular_matrix->index_[i][j] * d[j];
    }
    if (std::fabs(d[i]) <= kMinimumValueOfDiagonalElement) {
      return false;
    }
    lower_triangular_matrix->index_[i][i] = 1.0;
  }
  return true;
}